

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O1

void brotli::ZopfliIterate
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               size_t max_backward_limit,ZopfliCostModel *model,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *num_matches,
               vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_> *matches,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  BackwardMatch BVar4;
  undefined8 uVar5;
  pointer pZVar6;
  size_t sVar7;
  double *pdVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  uint8_t *puVar12;
  size_type sVar13;
  Command *pCVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  size_t dist_code;
  size_t sVar20;
  size_t insert_length;
  ulong uVar21;
  size_t sVar22;
  long lVar23;
  double dVar24;
  vector<unsigned_int,_std::allocator<unsigned_int>_> backwards;
  vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> nodes;
  StartPosQueue queue;
  Command cmd;
  size_t local_1b8;
  uint *local_198;
  iterator iStack_190;
  uint *local_188;
  size_t local_178;
  size_t local_170;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_168;
  vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> local_148;
  size_t local_130;
  size_type local_128;
  ulong local_120;
  StartPosQueue local_118;
  size_t local_f0;
  size_t local_e8;
  ulong local_e0;
  uint8_t *local_d8;
  uint8_t *local_d0;
  long local_c8;
  double local_c0;
  uint8_t *local_b8;
  ulong local_b0;
  ulong local_a8;
  double local_a0;
  size_t local_98;
  long local_90;
  size_t local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  BackwardMatch local_50;
  Command local_48;
  
  local_128 = num_bytes + 1;
  local_178 = ringbuffer_mask;
  local_f0 = position;
  local_e8 = max_backward_limit;
  local_d0 = ringbuffer;
  std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::vector
            (&local_148,local_128,(allocator_type *)&local_118);
  (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
   super__Vector_impl_data._M_start)->length = 0;
  (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
   super__Vector_impl_data._M_start)->cost = 0.0;
  uVar5 = *(undefined8 *)(dist_cache + 2);
  *(undefined8 *)
   (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
    super__Vector_impl_data._M_start)->distance_cache = *(undefined8 *)dist_cache;
  *(undefined8 *)
   ((local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
     super__Vector_impl_data._M_start)->distance_cache + 2) = uVar5;
  local_118.mask_ = 7;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x80);
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_118.q_.
       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_start + 8;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[7].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[7].second = 0.0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[6].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[6].second = 0.0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[5].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[5].second = 0.0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[4].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[4].second = 0.0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[3].second = 0.0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[2].second = 0.0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].first = 0;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_start[1].second = 0.0;
  (local_118.q_.
   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->first = 0;
  (local_118.q_.
   super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->second = 0.0;
  local_118.idx_ = 0;
  local_130 = num_bytes;
  local_118.q_.
  super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_118.q_.
       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (3 < num_bytes) {
    local_a0 = model->min_cost_cmd_;
    lVar11 = 0;
    sVar20 = 0;
    uVar17 = local_178;
    do {
      sVar22 = local_130;
      uVar21 = local_f0 + sVar20;
      sVar7 = local_e8;
      if (uVar21 < local_e8) {
        sVar7 = uVar21;
      }
      pdVar8 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_c8 = lVar11;
      StartPosQueue::Push(&local_118,sVar20,
                          local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar20].cost -
                          (pdVar8[sVar20] - *pdVar8));
      uVar19 = sVar22 - sVar20;
      local_58 = uVar21;
      local_98 = ComputeMinimumCopyLength(&local_118,&local_148,model,sVar20,local_a0);
      local_88 = local_98 - 1;
      local_d8 = local_d0 + (uVar21 & uVar17);
      local_a8 = uVar19 >> 3;
      local_b0 = uVar19 & 0xfffffffffffffff8;
      local_b8 = local_d8 + local_b0;
      local_e0 = (ulong)((uint)uVar19 & 7);
      local_90 = sVar20 * 0x30 + 0x58;
      local_70 = sVar20 * 0x30 + 0x28;
      uVar10 = 0;
      local_78 = uVar19;
      local_68 = uVar21 & uVar17;
      do {
        pZVar6 = local_148.
                 super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl
                 .super__Vector_impl_data._M_start;
        uVar21 = local_118.mask_ + 1;
        if (local_118.idx_ <= local_118.mask_ + 1) {
          uVar21 = local_118.idx_;
        }
        if (uVar21 <= uVar10) break;
        local_80 = uVar10 + 1;
        uVar3 = local_118.q_.
                super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start
                [local_80 - local_118.idx_ & local_118.mask_].first;
        piVar9 = local_148.
                 super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar3].distance_cache;
        pdVar8 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start;
        local_c0 = local_148.
                   super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar3].cost - (pdVar8[uVar3] - *pdVar8);
        insert_length = sVar20 - uVar3;
        dist_code = 0;
        sVar22 = local_88;
        local_120 = uVar10;
        do {
          uVar21 = (long)(int)(&kDistanceCacheOffset)[dist_code] +
                   (long)piVar9[(uint)(&kDistanceCacheIndex)[dist_code]];
          if (((uVar21 <= sVar7) && (local_58 - uVar21 < local_58)) && (local_68 + sVar22 <= uVar17)
             ) {
            uVar10 = local_58 - uVar21 & uVar17;
            if ((uVar10 + sVar22 <= uVar17) &&
               (local_d0[local_68 + sVar22] == local_d0[uVar10 + sVar22])) {
              if (7 < local_78) {
                lVar11 = 0;
                uVar17 = 0;
LAB_00168400:
                if (*(ulong *)(local_d8 + uVar17 * 8) == *(ulong *)(local_d0 + uVar17 * 8 + uVar10))
                goto code_r0x00168415;
                uVar10 = *(ulong *)(local_d0 + uVar17 * 8 + uVar10) ^
                         *(ulong *)(local_d8 + uVar17 * 8);
                uVar17 = 0;
                if (uVar10 != 0) {
                  for (; (uVar10 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar15 = (uVar17 >> 3 & 0x1fffffff) - lVar11;
                goto LAB_00168448;
              }
              puVar12 = local_d8;
              uVar19 = 0;
LAB_00168558:
              uVar15 = uVar19;
              if (local_e0 != 0) {
                uVar18 = uVar19 | local_e0;
                uVar17 = local_e0;
                do {
                  uVar15 = uVar19;
                  if (local_d0[uVar19 + uVar10] != *puVar12) break;
                  puVar12 = puVar12 + 1;
                  uVar19 = uVar19 + 1;
                  uVar17 = uVar17 - 1;
                  uVar15 = uVar18;
                } while (uVar17 != 0);
              }
LAB_00168448:
              uVar17 = local_178;
              if (sVar22 + 1 <= uVar15) {
                local_170 = CONCAT71(local_170._1_7_,dist_code != 0 && uVar21 <= sVar7);
                lVar11 = sVar22 * 0x30 + local_90;
                uVar10 = sVar22 + 1;
                do {
                  sVar22 = uVar10;
                  dVar24 = ZopfliCostModel::GetCommandCost(model,dist_code,sVar22,insert_length);
                  pdVar8 = (model->literal_costs_).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  dVar24 = (pdVar8[sVar20] - *pdVar8) + dVar24 + local_c0;
                  if (dVar24 < *(double *)
                                ((long)(local_148.
                                        super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                                lVar11 + -0xc)) {
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar11 + -0x34) = (int)sVar22;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar11 + -0x18) = (int)sVar22;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar11 + -0x30) = (int)uVar21;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar11 + -0x2c) = (int)dist_code;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar11 + -0x14) = (int)insert_length;
                    *(double *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar11 + -0xc) = dVar24;
                    if ((char)local_170 == '\0') {
                      uVar5 = *(undefined8 *)(pZVar6[uVar3].distance_cache + 2);
                      *(undefined8 *)
                       ((long)(local_148.
                               super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                       lVar11 + -0x28) = *(undefined8 *)piVar9;
                      *(undefined8 *)
                       ((long)(local_148.
                               super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                       lVar11 + -0x20) = uVar5;
                    }
                    else {
                      *(int *)((long)(local_148.
                                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                              lVar11 + -0x28) = (int)uVar21;
                      *(undefined8 *)
                       ((long)(local_148.
                               super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                               ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                       lVar11 + -0x24) = *(undefined8 *)piVar9;
                      *(int *)((long)(local_148.
                                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                              lVar11 + -0x1c) = pZVar6[uVar3].distance_cache[2];
                    }
                  }
                  lVar11 = lVar11 + 0x30;
                  uVar10 = sVar22 + 1;
                  uVar17 = local_178;
                } while (sVar22 + 1 <= uVar15);
              }
            }
          }
          dist_code = dist_code + 1;
        } while (dist_code != 0x10);
        if ((local_120 < 2) &&
           ((num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[sVar20] != 0)) {
          uVar17 = 0;
          sVar22 = local_98;
          do {
            BVar4 = (matches->
                    super__Vector_base<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>
                    )._M_impl.super__Vector_impl_data._M_start[local_c8 + uVar17];
            uVar10 = (ulong)BVar4 >> 0x25;
            uVar21 = uVar10;
            if (uVar10 < sVar22) {
              uVar21 = sVar22;
            }
            uVar19 = (ulong)BVar4 & 0xffffffff;
            if (sVar7 < uVar19) {
              sVar22 = uVar21;
            }
            if (0xa2 < BVar4.length_and_code >> 6) {
              sVar22 = uVar21;
            }
            local_60 = uVar17;
            if (sVar22 <= uVar10) {
              local_170 = uVar19 + 0xf;
              local_120 = (ulong)(BVar4.length_and_code & 0x1f);
              if (((ulong)BVar4 & 0x1f00000000) == 0) {
                local_120 = uVar10;
              }
              lVar11 = sVar22 * 0x30 + local_70;
              local_50 = BVar4;
              do {
                uVar17 = sVar22;
                if (sVar7 < uVar19) {
                  uVar17 = local_120;
                }
                dVar24 = ZopfliCostModel::GetCommandCost(model,local_170,uVar17,insert_length);
                pdVar8 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                dVar24 = (pdVar8[sVar20] - *pdVar8) + dVar24 + local_c0;
                if (dVar24 < *(double *)
                              ((long)(local_148.
                                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                              lVar11 + -0xc)) {
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar11 + -0x34) = (int)sVar22;
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar11 + -0x18) = (int)uVar17;
                  *(uint32_t *)
                   ((long)(local_148.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar11 + -0x30) = local_50.distance;
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar11 + -0x2c) = (int)local_170;
                  *(int *)((long)(local_148.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar11 + -0x14) = (int)insert_length;
                  *(double *)
                   ((long)(local_148.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar11 + -0xc) = dVar24;
                  if (sVar7 < uVar19) {
                    uVar5 = *(undefined8 *)(pZVar6[uVar3].distance_cache + 2);
                    *(undefined8 *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar11 + -0x28) = *(undefined8 *)piVar9;
                    *(undefined8 *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar11 + -0x20) = uVar5;
                  }
                  else {
                    *(uint32_t *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar11 + -0x28) = local_50.distance;
                    *(undefined8 *)
                     ((long)(local_148.
                             super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                             ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                     lVar11 + -0x24) = *(undefined8 *)piVar9;
                    *(int *)((long)(local_148.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar11 + -0x1c) = pZVar6[uVar3].distance_cache[2];
                  }
                }
                sVar22 = sVar22 + 1;
                lVar11 = lVar11 + 0x30;
              } while (uVar10 + 1 != sVar22);
            }
            uVar17 = local_60 + 1;
          } while (uVar17 < (num_matches->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_start[sVar20]);
        }
        uVar10 = local_80;
        uVar17 = local_178;
      } while (local_80 != 5);
      uVar21 = (ulong)(num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                      ._M_impl.super__Vector_impl_data._M_start[sVar20];
      lVar11 = local_c8 + uVar21;
      local_1b8 = sVar20;
      if ((uVar21 == 1) &&
         (uVar16 = (matches->
                   super__Vector_base<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>
                   )._M_impl.super__Vector_impl_data._M_start[lVar11 + -1].length_and_code,
         0x28bf < uVar16)) {
        local_118.idx_ = 0;
        local_1b8 = (sVar20 + (uVar16 >> 5)) - 1;
      }
      sVar20 = local_1b8 + 1;
    } while (local_1b8 + 4 < local_130);
  }
  sVar20 = local_130;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  pdVar8 = &local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
            _M_impl.super__Vector_impl_data._M_start[local_130].cost;
  sVar13 = local_128;
  do {
    dVar24 = *pdVar8;
    sVar13 = sVar13 - 1;
    pdVar8 = pdVar8 + -6;
  } while (INFINITY <= dVar24);
  if (sVar13 != 0) {
    do {
      uVar16 = local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar13].insert_length +
               local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
               ._M_impl.super__Vector_impl_data._M_start[sVar13].length;
      local_198 = (uint *)CONCAT44(local_198._4_4_,uVar16);
      if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (&local_168,
                   (iterator)
                   local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_finish,(uint *)&local_198);
      }
      else {
        *local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = uVar16;
        local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      sVar13 = sVar13 - uVar16;
    } while (sVar13 != 0);
  }
  local_198 = (uint *)0x0;
  iStack_190._M_current = (uint *)0x0;
  local_188 = (uint *)0x0;
  lVar11 = (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (lVar11 != 0) {
    lVar23 = lVar11 >> 2;
    do {
      lVar11 = lVar11 + -4;
      if (iStack_190._M_current == local_188) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_198,iStack_190,
                   (uint *)((long)local_168.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar11));
      }
      else {
        *iStack_190._M_current =
             *(uint *)((long)local_168.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar11);
        iStack_190._M_current = iStack_190._M_current + 1;
      }
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
  }
  pCVar14 = commands;
  if (iStack_190._M_current == local_198) {
    lVar11 = 0;
  }
  else {
    uVar17 = 0;
    lVar11 = 0;
    do {
      uVar10 = (ulong)local_198[uVar17];
      uVar16 = local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar11 + uVar10].length;
      uVar19 = (ulong)local_148.
                      super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                      _M_impl.super__Vector_impl_data._M_start[lVar11 + uVar10].insert_length;
      uVar21 = uVar19;
      if (uVar17 == 0) {
        uVar21 = *last_insert_len + uVar19;
        *last_insert_len = 0;
      }
      uVar1 = local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11 + uVar10].distance;
      uVar2 = local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11 + uVar10].distance_code;
      Command::Command(&local_48,uVar21,(ulong)uVar16,
                       (ulong)local_148.
                              super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                              ._M_impl.super__Vector_impl_data._M_start[lVar11 + uVar10].length_code
                       ,(ulong)uVar2);
      uVar10 = local_f0 + lVar11 + uVar19;
      if (local_e8 <= uVar10) {
        uVar10 = local_e8;
      }
      pCVar14->dist_extra_ = local_48.dist_extra_;
      pCVar14->cmd_prefix_ = local_48.cmd_prefix_;
      pCVar14->dist_prefix_ = local_48.dist_prefix_;
      pCVar14->insert_len_ = local_48.insert_len_;
      pCVar14->copy_len_ = local_48.copy_len_;
      pCVar14->cmd_extra_ = local_48.cmd_extra_;
      if ((uVar1 <= uVar10) && (uVar2 != 0)) {
        dist_cache[3] = dist_cache[2];
        *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
        *dist_cache = uVar1;
      }
      *num_literals = *num_literals + uVar21;
      pCVar14 = pCVar14 + 1;
      lVar11 = lVar11 + uVar19 + (ulong)uVar16;
      uVar17 = uVar17 + 1;
      sVar20 = local_130;
    } while (uVar17 < (ulong)((long)iStack_190._M_current - (long)local_198 >> 2));
  }
  *last_insert_len = *last_insert_len + (sVar20 - lVar11);
  *num_commands = *num_commands + ((long)pCVar14 - (long)commands >> 3) * -0x5555555555555555;
  if (local_198 != (uint *)0x0) {
    operator_delete(local_198,(long)local_188 - (long)local_198);
  }
  if (local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_118.q_.
      super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.q_.
                    super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.q_.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.q_.
                          super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.
                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.
                          super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
code_r0x00168415:
  uVar17 = uVar17 + 1;
  lVar11 = lVar11 + -8;
  puVar12 = local_b8;
  uVar19 = local_b0;
  if (local_a8 == uVar17) goto LAB_00168558;
  goto LAB_00168400;
}

Assistant:

void ZopfliIterate(size_t num_bytes,
                   size_t position,
                   const uint8_t* ringbuffer,
                   size_t ringbuffer_mask,
                   const size_t max_backward_limit,
                   const ZopfliCostModel& model,
                   const std::vector<uint32_t>& num_matches,
                   const std::vector<BackwardMatch>& matches,
                   int* dist_cache,
                   size_t* last_insert_len,
                   Command* commands,
                   size_t* num_commands,
                   size_t* num_literals) {
  const Command * const orig_commands = commands;

  std::vector<ZopfliNode> nodes(num_bytes + 1);
  nodes[0].length = 0;
  nodes[0].cost = 0;
  memcpy(nodes[0].distance_cache, dist_cache, 4 * sizeof(dist_cache[0]));

  StartPosQueue queue(3);
  const double min_cost_cmd = model.GetMinCostCmd();

  size_t cur_match_pos = 0;
  for (size_t i = 0; i + 3 < num_bytes; i++) {
    size_t cur_ix = position + i;
    size_t cur_ix_masked = cur_ix & ringbuffer_mask;
    size_t max_distance = std::min(cur_ix, max_backward_limit);
    size_t max_length = num_bytes - i;

    queue.Push(i, nodes[i].cost - model.GetLiteralCosts(0, i));

    const size_t min_len = ComputeMinimumCopyLength(queue, nodes, model,
                                                    i, min_cost_cmd);

    // Go over the command starting positions in order of increasing cost
    // difference.
    for (size_t k = 0; k < 5 && k < queue.size(); ++k) {
      const size_t start = queue.GetStartPos(k);
      const double start_costdiff =
          nodes[start].cost - model.GetLiteralCosts(0, start);
      const int* dist_cache2 = &nodes[start].distance_cache[0];

      // Look for last distance matches using the distance cache from this
      // starting position.
      size_t best_len = min_len - 1;
      for (size_t j = 0; j < kNumDistanceShortCodes; ++j) {
        const size_t idx = kDistanceCacheIndex[j];
        const size_t backward =
            static_cast<size_t>(dist_cache2[idx] + kDistanceCacheOffset[j]);
        size_t prev_ix = cur_ix - backward;
        if (prev_ix >= cur_ix) {
          continue;
        }
        if (PREDICT_FALSE(backward > max_distance)) {
          continue;
        }
        prev_ix &= ringbuffer_mask;

        if (cur_ix_masked + best_len > ringbuffer_mask ||
            prev_ix + best_len > ringbuffer_mask ||
            ringbuffer[cur_ix_masked + best_len] !=
            ringbuffer[prev_ix + best_len]) {
          continue;
        }
        const size_t len =
            FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                     &ringbuffer[cur_ix_masked],
                                     max_length);
        for (size_t l = best_len + 1; l <= len; ++l) {
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(j, l, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + l].cost) {
            UpdateZopfliNode(&nodes[0], i, start, l, l, backward, j,
                             max_distance, dist_cache2, cost);
          }
          best_len = l;
        }
      }

      // At higher iterations look only for new last distance matches, since
      // looking only for new command start positions with the same distances
      // does not help much.
      if (k >= 2) continue;

      // Loop through all possible copy lengths at this position.
      size_t len = min_len;
      for (size_t j = 0; j < num_matches[i]; ++j) {
        BackwardMatch match = matches[cur_match_pos + j];
        size_t dist = match.distance;
        bool is_dictionary_match = dist > max_distance;
        // We already tried all possible last distance matches, so we can use
        // normal distance code here.
        size_t dist_code = dist + 15;
        // Try all copy lengths up until the maximum copy length corresponding
        // to this distance. If the distance refers to the static dictionary, or
        // the maximum length is long enough, try only one maximum length.
        size_t max_len = match.length();
        if (len < max_len && (is_dictionary_match || max_len > kMaxZopfliLen)) {
          len = max_len;
        }
        for (; len <= max_len; ++len) {
          size_t len_code = is_dictionary_match ? match.length_code() : len;
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(dist_code, len_code, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + len].cost) {
            UpdateZopfliNode(&nodes[0], i, start, len, len_code, dist,
                             dist_code, max_distance, dist_cache2, cost);
          }
        }
      }
    }

    cur_match_pos += num_matches[i];

    // The zopflification can be too slow in case of very long lengths, so in
    // such case skip it all, it does not cost a lot of compression ratio.
    if (num_matches[i] == 1 &&
        matches[cur_match_pos - 1].length() > kMaxZopfliLen) {
      i += matches[cur_match_pos - 1].length() - 1;
      queue.Clear();
    }
  }

  std::vector<uint32_t> backwards;
  size_t index = num_bytes;
  while (nodes[index].cost == kInfinity) --index;
  while (index != 0) {
    size_t len = nodes[index].length + nodes[index].insert_length;
    backwards.push_back(static_cast<uint32_t>(len));
    index -= len;
  }

  std::vector<uint32_t> path;
  for (size_t i = backwards.size(); i > 0; i--) {
    path.push_back(backwards[i - 1]);
  }

  size_t pos = 0;
  for (size_t i = 0; i < path.size(); i++) {
    const ZopfliNode& next = nodes[pos + path[i]];
    size_t copy_length = next.length;
    size_t insert_length = next.insert_length;
    pos += insert_length;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    size_t distance = next.distance;
    size_t len_code = next.length_code;
    size_t max_distance = std::min(position + pos, max_backward_limit);
    bool is_dictionary = (distance > max_distance);
    size_t dist_code = next.distance_code;

    Command cmd(insert_length, copy_length, len_code, dist_code);
    *commands++ = cmd;

    if (!is_dictionary && dist_code > 0) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = dist_cache[0];
      dist_cache[0] = static_cast<int>(distance);
    }

    *num_literals += insert_length;
    insert_length = 0;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}